

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O1

void __thiscall
capnp::SegmentArrayMessageReader::~SegmentArrayMessageReader(SegmentArrayMessageReader *this)

{
  (this->super_MessageReader)._vptr_MessageReader =
       (_func_int **)&PTR__SegmentArrayMessageReader_001c11a0;
  if ((this->super_MessageReader).allocatedArena == true) {
    _::ReaderArena::~ReaderArena((ReaderArena *)(this->super_MessageReader).arenaSpace);
  }
  operator_delete(this,0xe0);
  return;
}

Assistant:

SegmentArrayMessageReader::~SegmentArrayMessageReader() noexcept(false) {}